

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void reallymarkobject(global_State *g,GCObject *o)

{
  undefined1 *puVar1;
  GCObject *pGVar2;
  byte bVar3;
  GCObject **pnext;
  char *pcVar4;
  
  do {
    bVar3 = o->tt;
    switch(bVar3) {
    case 4:
    case 0x14:
      o->marked = o->marked & 199 | 0x20;
      return;
    case 5:
    case 6:
    case 8:
    case 9:
switchD_0012b955_caseD_5:
      if ((bVar3 & 0xe) < 10) {
        pnext = getgclist(o);
        linkgclist_(o,pnext,&g->gray);
        return;
      }
      __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x19f,"void reallymarkobject(global_State *, GCObject *)");
    case 7:
      pGVar2 = o[1].next;
      if ((pGVar2 == (GCObject *)0x0) || ((pGVar2->marked & 0x18) == 0)) {
        o->marked = o->marked & 199 | 0x20;
      }
      else {
        if (9 < (pGVar2->tt & 0xe)) {
          __assert_fail("((((((void) sizeof (((o)->tt == 7) ? 1 : 0), __extension__ ({ if ((o)->tt == 7) ; else __assert_fail (\"(o)->tt == 7\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c\", 387, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((o))))->u)))->metatable)->tt) & 0x0F) < (9+1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x183,"void reallymarkobject(global_State *, GCObject *)");
        }
        reallymarkobject(g,pGVar2);
        o->marked = o->marked & 199 | 0x20;
        if (o->tt != '\a') {
          pcVar4 = "(o)->tt == 7";
          goto LAB_0012bb33;
        }
      }
      puVar1 = &o->field_0xa;
      if (-1 < (short)*(ushort *)puVar1) {
        return;
      }
      o = o[2].next;
      if ((*(ushort *)puVar1 & 0x7f) != (ushort)o->tt) {
LAB_0012bb2c:
        pcVar4 = "0";
LAB_0012bb33:
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x185,"void reallymarkobject(global_State *, GCObject *)");
      }
      bVar3 = o->marked;
      if ((g->mainthread != (lua_State *)0x0) &&
         (((g->mainthread->l_G->currentwhite ^ 0x18) & bVar3) != 0)) goto LAB_0012bb2c;
      goto LAB_0012ba99;
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
switchD_0012b955_caseD_a:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1a2,"void reallymarkobject(global_State *, GCObject *)");
    case 0x15:
      goto switchD_0012b955_caseD_15;
    }
    if (bVar3 != 0x25) {
      if (bVar3 != 0x26) goto switchD_0012b955_caseD_a;
      goto switchD_0012b955_caseD_5;
    }
switchD_0012b955_caseD_15:
    pGVar2 = *(GCObject **)&o[3].tt;
    if (pGVar2 != (GCObject *)0x0) {
      if ((bVar3 == 0x15) || (bVar3 == 0x25)) {
        if ((pGVar2->marked & 0x18) == 0) goto LAB_0012b9f5;
        if ((bVar3 == 0x15) || (bVar3 == 0x25)) {
          if (9 < (pGVar2->tt & 0xe)) {
            pcVar4 = 
            "((((((void) sizeof ((((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))) ? 1 : 0), __extension__ ({ if (((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))) ; else __assert_fail (\"((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c\", 400, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((o))))->arr)))->metatable)->tt) & 0x0F) < (9+1)"
            ;
            goto LAB_0012bb7a;
          }
          if ((bVar3 == 0x15) || (bVar3 == 0x25)) {
            reallymarkobject(g,pGVar2);
            goto LAB_0012b9f5;
          }
        }
      }
      pcVar4 = "((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))";
LAB_0012bb7a:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,400,"void reallymarkobject(global_State *, GCObject *)");
    }
LAB_0012b9f5:
    o->marked = o->marked & 199 | 0x20;
    if ((o->field_0xa & 1) == 0) {
      return;
    }
    o = *(GCObject **)&o[1].tt;
    if (o == (GCObject *)0x0) {
      __assert_fail("slice->parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x194,"void reallymarkobject(global_State *, GCObject *)");
    }
    if (9 < (o->tt & 0xe)) {
      pcVar4 = "(((is->parent)->tt) & 0x0F) < (9+1)";
      goto LAB_0012bb14;
    }
    if ((char)o->tt < '\0') {
LAB_0012bae5:
      pcVar4 = "0";
LAB_0012bb14:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x195,"void reallymarkobject(global_State *, GCObject *)");
    }
    bVar3 = o->marked;
    if ((g->mainthread != (lua_State *)0x0) &&
       (((g->mainthread->l_G->currentwhite ^ 0x18) & bVar3) != 0)) goto LAB_0012bae5;
LAB_0012ba99:
    if ((bVar3 & 0x18) == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
 reentry:
  switch (o->tt) {
    case LUA_TSHRSTR:
    case LUA_TLNGSTR: {
      set2black(o);  /* nothing to visit */
      break;
    }
    case LUA_TUSERDATA: {
      TValue uvalue;
      markobjectN(g, gco2u(o)->metatable);  /* mark its metatable */
      set2black(o);
      getuservalue(g->mainthread, gco2u(o), &uvalue);
      if (valiswhite(&uvalue)) {
        o = gcvalue(&uvalue);
        goto reentry;
      }
      break;
    }
    /* arrays are treated like userdata. */
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      RaviArray *slice = gco2array(o);
      markobjectN(g, gco2array(o)->metatable);  /* mark its metatable */
      set2black(o);
      if (slice->flags & RAVI_ARRAY_SLICE) {
        TValue pvalue;
        lua_assert(slice->parent);
        getsliceunderlying(g->mainthread, slice, &pvalue);
        if (valiswhite(&pvalue)) {
          o = gcvalue(&pvalue);
          goto reentry;
        }
      }
      break;
    }
    case LUA_TLCL: case LUA_TCCL: case LUA_TTABLE: 
	case LUA_TTHREAD: case LUA_TPROTO: {
      linkobjgclist(o, g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}